

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

bool __thiscall Loader::loadBin(Loader *this,string *file)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  allocator local_292;
  allocator local_291;
  duration<long,_std::ratio<1L,_1000L>_> local_290;
  string reversedBinStr;
  string binStr;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  psVar3 = file;
  std::__cxx11::string::string((string *)&local_48,(string *)file);
  fileToBinStr(&binStr,(Loader *)psVar3,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (CONCAT44(binStr._M_string_length._4_4_,(int)binStr._M_string_length) == 0) {
    std::operator+(&reversedBinStr,"Failed to read bin file: ",file);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&reversedBinStr);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&reversedBinStr);
    bVar1 = false;
    goto LAB_00111280;
  }
  psVar3 = &binStr;
  std::__cxx11::string::string((string *)&local_68,(string *)psVar3);
  reverseBytes(&reversedBinStr,(Loader *)psVar3,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = Jtag::setFreq(this->device,10000000.0);
  if (bVar1) {
    bVar1 = resetState(this);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setState(this,RUN_TEST_IDLE);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setIR(this,JPROGRAM);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setIR(this,ISC_NOOP);
    if (!bVar1) goto LAB_00111274;
    local_290.__r = 100;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_290);
    bVar1 = Jtag::sendClocks(this->device,10000);
    if (!bVar1) goto LAB_00111274;
    std::__cxx11::string::string((string *)&local_88,"14",(allocator *)&local_290);
    std::__cxx11::string::string((string *)&local_a8,"11",&local_292);
    std::__cxx11::string::string((string *)&local_c8,"31",&local_291);
    bVar1 = shiftIR(this,6,&local_88,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setIR(this,CFG_IN);
    if (!bVar1) goto LAB_00111274;
    std::__cxx11::string::string((string *)&local_e8,(string *)&reversedBinStr);
    std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_290);
    std::__cxx11::string::string((string *)&local_128,"",&local_292);
    bVar1 = shiftDR(this,(int)binStr._M_string_length << 2,&local_e8,&local_108,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setState(this,RUN_TEST_IDLE);
    if (!bVar1) goto LAB_00111274;
    bVar1 = Jtag::sendClocks(this->device,100000);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setIR(this,JSTART);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setState(this,RUN_TEST_IDLE);
    if (!bVar1) goto LAB_00111274;
    bVar1 = Jtag::sendClocks(this->device,100);
    if (!bVar1) goto LAB_00111274;
    std::__cxx11::string::string((string *)&local_148,"09",(allocator *)&local_290);
    std::__cxx11::string::string((string *)&local_168,"31",&local_292);
    std::__cxx11::string::string((string *)&local_188,"11",&local_291);
    bVar1 = shiftIR(this,6,&local_148,&local_168,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setState(this,TEST_LOGIC_RESET);
    if (!bVar1) goto LAB_00111274;
    bVar1 = Jtag::sendClocks(this->device,5);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setIR(this,CFG_IN);
    if (!bVar1) goto LAB_00111274;
    std::__cxx11::string::string
              ((string *)&local_1a8,"0000000400000004800700140000000466aa9955",
               (allocator *)&local_290);
    std::__cxx11::string::string((string *)&local_1c8,"",&local_292);
    std::__cxx11::string::string((string *)&local_1e8,"",&local_291);
    bVar1 = shiftDR(this,0xa0,&local_1a8,&local_1c8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setIR(this,CFG_OUT);
    if (!bVar1) goto LAB_00111274;
    std::__cxx11::string::string((string *)&local_208,"00000000",(allocator *)&local_290);
    std::__cxx11::string::string((string *)&local_228,"3f5e0d40",&local_292);
    std::__cxx11::string::string((string *)&local_248,"08000000",&local_291);
    bVar1 = shiftDR(this,0x20,&local_208,&local_228,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    if (!bVar1) goto LAB_00111274;
    bVar1 = setState(this,TEST_LOGIC_RESET);
    if (!bVar1) goto LAB_00111274;
    bVar1 = Jtag::sendClocks(this->device,5);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to set JTAG frequency!");
    std::endl<char,std::char_traits<char>>(poVar2);
LAB_00111274:
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&reversedBinStr);
LAB_00111280:
  std::__cxx11::string::~string((string *)&binStr);
  return bVar1;
}

Assistant:

bool Loader::loadBin(string file) {
	string binStr = fileToBinStr(file);

    if (binStr.empty()) {
        cerr << "Failed to read bin file: "+ file << endl;
        return false;
    }

	string reversedBinStr = reverseBytes(binStr);

	if (!device->setFreq(10000000)) {
		cerr << "Failed to set JTAG frequency!" << endl;
		return false;
	}
	if (!resetState())
		return false;
	if (!setState(Jtag_fsm::RUN_TEST_IDLE))
		return false;

	if (!setIR(JPROGRAM))
		return false;
	if (!setIR(ISC_NOOP))
		return false;
	std::this_thread::sleep_for(std::chrono::milliseconds(100));

	// config/jprog/poll
	if (!device->sendClocks(10000))
		return false;
	if (!shiftIR(6, "14", "11", "31"))
		return false;

	// config/slr
	if (!setIR(CFG_IN))
		return false;
	if (!shiftDR(binStr.length() * 4, reversedBinStr, "", ""))
		return false;

	// config/start
	if (!setState(Jtag_fsm::RUN_TEST_IDLE))
		return false;
	if (!device->sendClocks(100000))
		return false;
	if (!setIR(JSTART))
		return false;
	if (!setState(Jtag_fsm::RUN_TEST_IDLE))
		return false;
	if (!device->sendClocks(100))
		return false;
	if (!shiftIR(6, "09", "31", "11"))
		return false;

	// config/status
	if (!setState(Jtag_fsm::TEST_LOGIC_RESET))
		return false;
	if (!device->sendClocks(5))
		return false;
	if (!setIR(CFG_IN))
		return false;
	if (!shiftDR(160, "0000000400000004800700140000000466aa9955", "", ""))
		return false;
	if (!setIR(CFG_OUT))
		return false;
	if (!shiftDR(32, "00000000", "3f5e0d40", "08000000"))
		return false;
	if (!setState(Jtag_fsm::TEST_LOGIC_RESET))
		return false;
	if (!device->sendClocks(5))
		return false;

	return true;
}